

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O1

Array * __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::resize_array
          (UnboundedTaskQueue<tf::Node_*> *this,Array *a,int64_t b,int64_t t)

{
  pointer *pppAVar1;
  iterator __position;
  Array *pAVar2;
  Array *local_18;
  
  local_18 = a;
  pAVar2 = Array::resize(a,b,t);
  __position._M_current =
       (this->_garbage).
       super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_garbage).
      super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<tf::UnboundedTaskQueue<tf::Node*>::Array*,std::allocator<tf::UnboundedTaskQueue<tf::Node*>::Array*>>
    ::_M_realloc_insert<tf::UnboundedTaskQueue<tf::Node*>::Array*const&>
              ((vector<tf::UnboundedTaskQueue<tf::Node*>::Array*,std::allocator<tf::UnboundedTaskQueue<tf::Node*>::Array*>>
                *)&this->_garbage,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppAVar1 = &(this->_garbage).
                super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  (this->_array)._M_b._M_p = pAVar2;
  return pAVar2;
}

Assistant:

typename UnboundedTaskQueue<T>::Array*
UnboundedTaskQueue<T>::resize_array(Array* a, int64_t b, int64_t t) {

  //Array* tmp = a->resize(b, t);
  //_garbage.push_back(a);
  //std::swap(a, tmp);
  //_array.store(a, std::memory_order_release);
  //// Note: the original paper using relaxed causes t-san to complain
  ////_array.store(a, std::memory_order_relaxed);
  //return a;
  

  Array* tmp = a->resize(b, t);
  _garbage.push_back(a);
  _array.store(tmp, std::memory_order_release);
  // Note: the original paper using relaxed causes t-san to complain
  //_array.store(a, std::memory_order_relaxed);
  return tmp;
}